

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O0

int If_CutMergeOrdered(If_Man_t *p,If_Cut_t *pC0,If_Cut_t *pC1,If_Cut_t *pC)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint local_48;
  int s;
  int c;
  int k;
  int i;
  int nLimit;
  int nSizeC1;
  int nSizeC0;
  If_Cut_t *pC_local;
  If_Cut_t *pC1_local;
  If_Cut_t *pC0_local;
  If_Man_t *p_local;
  
  uVar3 = *(uint *)&pC0->field_0x1c >> 0x18;
  uVar4 = *(uint *)&pC1->field_0x1c >> 0x18;
  uVar5 = *(uint *)&pC0->field_0x1c >> 0x10 & 0xff;
  if ((uVar3 == uVar5) && (uVar4 == uVar5)) {
    for (c = 0; c < (int)uVar3; c = c + 1) {
      if ((&pC0[1].Area)[c] != (&pC1[1].Area)[c]) {
        return 0;
      }
      (&pC[1].Area)[c] = (&pC0[1].Area)[c];
    }
    *(uint *)&pC->field_0x1c = *(uint *)&pC->field_0x1c & 0xffffff | uVar5 << 0x18;
    pC->uSign = pC0->uSign | pC1->uSign;
    p_local._4_4_ = 1;
  }
  else {
    local_48 = 0;
    s = 0;
    c = 0;
    uVar1 = local_48;
    iVar2 = s;
    if (uVar3 == 0) {
LAB_00b64619:
      s = iVar2;
      local_48 = uVar1;
      if ((int)(uVar5 + s) < (int)(local_48 + uVar4)) {
        p_local._4_4_ = 0;
      }
      else {
        while (s < (int)uVar4) {
          (&pC[1].Area)[(int)local_48] = (&pC1[1].Area)[s];
          local_48 = local_48 + 1;
          s = s + 1;
        }
        *(uint *)&pC->field_0x1c = *(uint *)&pC->field_0x1c & 0xffffff | local_48 << 0x18;
        pC->uSign = pC0->uSign | pC1->uSign;
        p_local._4_4_ = 1;
      }
    }
    else if (uVar4 == 0) {
LAB_00b64586:
      local_48 = uVar1;
      if ((int)(uVar5 + c) < (int)(local_48 + uVar3)) {
        p_local._4_4_ = 0;
      }
      else {
        while (c < (int)uVar3) {
          (&pC[1].Area)[(int)local_48] = (&pC0[1].Area)[c];
          local_48 = local_48 + 1;
          c = c + 1;
        }
        *(uint *)&pC->field_0x1c = *(uint *)&pC->field_0x1c & 0xffffff | local_48 << 0x18;
        pC->uSign = pC0->uSign | pC1->uSign;
        p_local._4_4_ = 1;
      }
    }
    else {
      for (; local_48 != uVar5; local_48 = local_48 + 1) {
        if ((int)(&pC0[1].Area)[c] < (int)(&pC1[1].Area)[s]) {
          uVar6 = c + 1;
          (&pC[1].Area)[(int)local_48] = (&pC0[1].Area)[c];
          uVar1 = local_48 + 1;
          iVar2 = s;
          c = uVar6;
          if (uVar6 == uVar3) goto LAB_00b64619;
        }
        else {
          if ((int)(&pC1[1].Area)[s] < (int)(&pC0[1].Area)[c]) {
            (&pC[1].Area)[(int)local_48] = (&pC1[1].Area)[s];
          }
          else {
            uVar6 = c + 1;
            (&pC[1].Area)[(int)local_48] = (&pC0[1].Area)[c];
            uVar1 = local_48 + 1;
            iVar2 = s + 1;
            c = uVar6;
            if (uVar6 == uVar3) goto LAB_00b64619;
          }
          uVar1 = local_48 + 1;
          if (s + 1U == uVar4) goto LAB_00b64586;
          s = s + 1;
        }
      }
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

int If_CutMergeOrdered( If_Man_t * p, If_Cut_t * pC0, If_Cut_t * pC1, If_Cut_t * pC )
{ 
    int nSizeC0 = pC0->nLeaves;
    int nSizeC1 = pC1->nLeaves;
    int nLimit  = pC0->nLimit;
    int i, k, c, s;

    // both cuts are the largest
    if ( nSizeC0 == nLimit && nSizeC1 == nLimit )
    {
        for ( i = 0; i < nSizeC0; i++ )
        {
            if ( pC0->pLeaves[i] != pC1->pLeaves[i] )
                return 0;
            pC->pLeaves[i] = pC0->pLeaves[i];
        }
        pC->nLeaves = nLimit;
        pC->uSign = pC0->uSign | pC1->uSign;
        return 1;
    }

    // compare two cuts with different numbers
    i = k = c = s = 0; 
    if ( nSizeC0 == 0 ) goto FlushCut1;
    if ( nSizeC1 == 0 ) goto FlushCut0;
    while ( 1 )
    {
        if ( c == nLimit ) return 0;
        if ( pC0->pLeaves[i] < pC1->pLeaves[k] )
        {
            pC->pLeaves[c++] = pC0->pLeaves[i++];
            if ( i == nSizeC0 ) goto FlushCut1;
        }
        else if ( pC0->pLeaves[i] > pC1->pLeaves[k] )
        {
            pC->pLeaves[c++] = pC1->pLeaves[k++];
            if ( k == nSizeC1 ) goto FlushCut0;
        }
        else
        {
            pC->pLeaves[c++] = pC0->pLeaves[i++]; k++;
            if ( i == nSizeC0 ) goto FlushCut1;
            if ( k == nSizeC1 ) goto FlushCut0;
        }
    }

FlushCut0:
    if ( c + nSizeC0 > nLimit + i ) return 0;
    while ( i < nSizeC0 )
        pC->pLeaves[c++] = pC0->pLeaves[i++];
    pC->nLeaves = c;
    pC->uSign = pC0->uSign | pC1->uSign;
    return 1;

FlushCut1:
    if ( c + nSizeC1 > nLimit + k ) return 0;
    while ( k < nSizeC1 )
        pC->pLeaves[c++] = pC1->pLeaves[k++];
    pC->nLeaves = c;
    pC->uSign = pC0->uSign | pC1->uSign;
    return 1;
}